

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void block(LexState *ls)

{
  undefined1 local_30 [8];
  BlockCnt bl;
  FuncState *fs;
  LexState *ls_local;
  
  bl._16_8_ = ls->fs;
  enterblock((FuncState *)bl._16_8_,(BlockCnt *)local_30,'\0');
  statlist(ls);
  leaveblock((FuncState *)bl._16_8_);
  return;
}

Assistant:

static void block(LexState *ls) {
    /* block -> statlist */
    FuncState *fs = ls->fs;
    BlockCnt bl;
    enterblock(fs, &bl, 0);
    statlist(ls);
    leaveblock(fs);
}